

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeFunctionPrototype
               (DynamicObject *functionPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  ScriptContext *this;
  JavascriptLibrary *this_00;
  Type *builtInFuncs;
  RuntimeFunction **ppRVar1;
  Var value;
  JavascriptString *value_00;
  JavascriptFunction *pJVar2;
  JavascriptMethod entryPoint;
  JavascriptFunction **ppJVar3;
  JavascriptFunction *func;
  Type *builtinFuncs;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *functionPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,functionPrototype,mode,7,0);
  this = RecyclableObject::GetScriptContext(&functionPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&functionPrototype->super_RecyclableObject);
  builtInFuncs = GetBuiltinFunctions(this_00);
  ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)
                       &(this_00->super_JavascriptLibraryBase).functionConstructor);
  AddMember(this_00,functionPrototype,0x67,*ppRVar1);
  value = TaggedInt::ToVarUnchecked(0);
  AddMember(this_00,functionPrototype,0xd1,value,'\x02');
  value_00 = GetEmptyString(this_00);
  AddMember(this_00,functionPrototype,0x106,value_00,'\x02');
  pJVar2 = AddFunctionToLibraryObject
                     (this_00,functionPrototype,0x4e,
                      (FunctionInfo *)JavascriptFunction::EntryInfo::Apply,2,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x3c,pJVar2);
  AddFunctionToLibraryObject
            (this_00,functionPrototype,0x54,(FunctionInfo *)JavascriptFunction::EntryInfo::Bind,1,
             '\x06');
  pJVar2 = AddFunctionToLibraryObject
                     (this_00,functionPrototype,0x5a,
                      (FunctionInfo *)JavascriptFunction::EntryInfo::Call,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x3d,pJVar2);
  AddFunctionToLibraryObject
            (this_00,functionPrototype,0x178,(FunctionInfo *)JavascriptFunction::EntryInfo::ToString
             ,0,'\x06');
  entryPoint = FunctionInfo::GetOriginalEntryPoint
                         ((FunctionInfo *)JavascriptFunction::EntryInfo::SymbolHasInstance);
  pJVar2 = AddFunctionToLibraryObjectWithName
                     (this_00,functionPrototype,0x12,0x2c2,
                      (FunctionInfo *)JavascriptFunction::EntryInfo::SymbolHasInstance,1);
  ScriptContext::SetBuiltInLibraryFunction(this,entryPoint,pJVar2);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x3b])(functionPrototype,0x12,0);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x3c])(functionPrototype,0x12,0);
  ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)
                       &(this_00->super_JavascriptLibraryBase).
                        throwTypeErrorRestrictedPropertyAccessorFunction);
  pJVar2 = *ppJVar3;
  ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)
                       &(this_00->super_JavascriptLibraryBase).
                        throwTypeErrorRestrictedPropertyAccessorFunction);
  DynamicObject::SetAccessors(functionPrototype,0x1cd,pJVar2,*ppJVar3,PropertyOperation_None);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x3d])(functionPrototype,0x1cd,0);
  ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)
                       &(this_00->super_JavascriptLibraryBase).
                        throwTypeErrorRestrictedPropertyAccessorFunction);
  pJVar2 = *ppJVar3;
  ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)
                       &(this_00->super_JavascriptLibraryBase).
                        throwTypeErrorRestrictedPropertyAccessorFunction);
  DynamicObject::SetAccessors(functionPrototype,0x1cf,pJVar2,*ppJVar3,PropertyOperation_None);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x3d])(functionPrototype,0x1cf,0);
  CheckRegisteredBuiltIns(builtInFuncs,this);
  DynamicObject::SetHasNoEnumerableProperties(functionPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeFunctionPrototype(DynamicObject* functionPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(functionPrototype, mode, 7);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterFunction
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = functionPrototype->GetScriptContext();
        JavascriptLibrary* library = functionPrototype->GetLibrary();
        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

        library->AddMember(functionPrototype, PropertyIds::constructor, library->functionConstructor);
        library->AddMember(functionPrototype, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(functionPrototype, PropertyIds::name, library->GetEmptyString(), PropertyConfigurable);

        JavascriptFunction *func = library->AddFunctionToLibraryObject(functionPrototype, PropertyIds::apply, &JavascriptFunction::EntryInfo::Apply, 2);
        builtinFuncs[BuiltinFunction::JavascriptFunction_Apply] = func;

        library->AddFunctionToLibraryObject(functionPrototype, PropertyIds::bind, &JavascriptFunction::EntryInfo::Bind, 1);
        func = library->AddFunctionToLibraryObject(functionPrototype, PropertyIds::call, &JavascriptFunction::EntryInfo::Call, 1);
        builtinFuncs[BuiltinFunction::JavascriptFunction_Call] = func;
        library->AddFunctionToLibraryObject(functionPrototype, PropertyIds::toString, &JavascriptFunction::EntryInfo::ToString, 0);

        scriptContext->SetBuiltInLibraryFunction(JavascriptFunction::EntryInfo::SymbolHasInstance.GetOriginalEntryPoint(),
                                                    library->AddFunctionToLibraryObjectWithName(functionPrototype, PropertyIds::_symbolHasInstance, PropertyIds::_RuntimeFunctionNameId_hasInstance,
                                                                                                &JavascriptFunction::EntryInfo::SymbolHasInstance, 1));
        functionPrototype->SetWritable(PropertyIds::_symbolHasInstance, false);
        functionPrototype->SetConfigurable(PropertyIds::_symbolHasInstance, false);

        functionPrototype->DynamicObject::SetAccessors(PropertyIds::caller, library->throwTypeErrorRestrictedPropertyAccessorFunction, library->throwTypeErrorRestrictedPropertyAccessorFunction);
        functionPrototype->SetEnumerable(PropertyIds::caller, false);
        functionPrototype->DynamicObject::SetAccessors(PropertyIds::arguments, library->throwTypeErrorRestrictedPropertyAccessorFunction, library->throwTypeErrorRestrictedPropertyAccessorFunction);
        functionPrototype->SetEnumerable(PropertyIds::arguments, false);

        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        functionPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }